

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExplicitAnsiPortSyntax,slang::syntax::ExplicitAnsiPortSyntax_const&>
          (BumpAllocator *this,ExplicitAnsiPortSyntax *args)

{
  ExplicitAnsiPortSyntax *pEVar1;
  ExplicitAnsiPortSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pEVar1 = (ExplicitAnsiPortSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ExplicitAnsiPortSyntax::ExplicitAnsiPortSyntax(in_RSI,pEVar1);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }